

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O0

void * coll_seq_prepend(coll_seq_t *seq,void *data)

{
  coll_seq_node_t *pcVar1;
  node_t_conflict *node;
  void *data_local;
  coll_seq_t *seq_local;
  
  if (seq == (coll_seq_t *)0x0) {
    seq_local = (coll_seq_t *)0x0;
  }
  else {
    pcVar1 = (coll_seq_node_t *)malloc(0x10);
    pcVar1->data = data;
    pcVar1->next = seq->head;
    seq->head = pcVar1;
    seq->len = seq->len + 1;
    seq_local = (coll_seq_t *)data;
  }
  return seq_local;
}

Assistant:

void *coll_seq_prepend(coll_seq_t *seq, void *data) {
    if (!seq) {
        return NULL;
    }
    node_t *node = malloc(sizeof(node_t));
    node->data = data;
    node->next = seq->head;
    seq->head = node;
    ++(seq->len);
    return data;
}